

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::setGroupSeparatorShown(QAbstractSpinBox *this,bool shown)

{
  byte bVar1;
  QAbstractSpinBoxPrivate *pQVar2;
  byte in_SIL;
  QAbstractSpinBoxPrivate *in_RDI;
  QAbstractSpinBoxPrivate *d;
  undefined7 in_stack_fffffffffffffff0;
  QAbstractSpinBoxPrivate *this_00;
  
  bVar1 = in_SIL & 1;
  this_00 = in_RDI;
  pQVar2 = d_func((QAbstractSpinBox *)0x685475);
  if ((*(ushort *)&pQVar2->field_0x3d0 >> 9 & 1) != (ushort)(bVar1 & 1)) {
    *(ushort *)&pQVar2->field_0x3d0 =
         *(ushort *)&pQVar2->field_0x3d0 & 0xfdff | (ushort)(bVar1 & 1) << 9;
    QAbstractSpinBoxPrivate::setValue
              (this_00,(QVariant *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
               (EmitPolicy)((ulong)pQVar2 >> 0x20),SUB81((ulong)pQVar2 >> 0x18,0));
    QWidget::updateGeometry((QWidget *)in_RDI);
  }
  return;
}

Assistant:

void QAbstractSpinBox::setGroupSeparatorShown(bool shown)
{
    Q_D(QAbstractSpinBox);
    if (d->showGroupSeparator == shown)
        return;
    d->showGroupSeparator = shown;
    d->setValue(d->value, EmitIfChanged);
    updateGeometry();
}